

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildmidi_lib.cpp
# Opt level: O0

void do_note_off(_mdi *mdi,_event_data *data)

{
  byte bVar1;
  _note *p_Stack_20;
  uchar ch;
  _note *nte;
  _event_data *data_local;
  _mdi *mdi_local;
  
  bVar1 = data->channel;
  p_Stack_20 = mdi->note_table[0][bVar1] + (data->data >> 8);
  if (p_Stack_20->active == '\0') {
    p_Stack_20 = mdi->note_table[1][bVar1] + (data->data >> 8);
  }
  if ((p_Stack_20->active != '\0') &&
     ((mdi->channel[bVar1].isdrum == '\0' || ((p_Stack_20->modes & 4) != 0)))) {
    if (((p_Stack_20->modes & 0x40) == 0) || (p_Stack_20->env != '\0')) {
      do_note_off_extra(p_Stack_20);
    }
    else {
      p_Stack_20->is_off = '\x01';
    }
  }
  return;
}

Assistant:

static void do_note_off(struct _mdi *mdi, struct _event_data *data) {
	struct _note *nte;
	unsigned char ch = data->channel;

	MIDI_EVENT_DEBUG(__FUNCTION__,ch);

	nte = &mdi->note_table[0][ch][(data->data >> 8)];
	if (!nte->active)
		nte = &mdi->note_table[1][ch][(data->data >> 8)];
	if (!nte->active) {
		return;
	}

	if ((mdi->channel[ch].isdrum) && (!(nte->modes & SAMPLE_LOOP))) {
		return;
	}

	if ((nte->modes & SAMPLE_ENVELOPE) && (nte->env == 0)) {
		// This is a fix for notes that end before the
		// initial step of the envelope has completed
		// making it impossible to hear them at times.
		nte->is_off = 1;
	} else {
		do_note_off_extra(nte);
	}
}